

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O3

DeviceAPI * __thiscall
tvm::runtime::DeviceAPIManager::GetAPI(DeviceAPIManager *this,string *name,bool allow_missing)

{
  _Any_data *p_Var1;
  DeviceAPI *pDVar2;
  ostream *poVar3;
  undefined8 uVar4;
  string factory;
  TVMValue_conflict values [1];
  TVMPODValue_ TStack_1e8;
  TVMRetValue *local_1d8;
  int local_1cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  TVMValue_conflict local_1a8;
  undefined1 local_1a0 [16];
  int local_190;
  
  std::operator+(&local_1c8,"device_api.",name);
  p_Var1 = (_Any_data *)Registry::Get(&local_1c8);
  if (p_Var1 == (_Any_data *)0x0) {
    if (!allow_missing) {
      dmlc::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_1a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/c_runtime_api.cc"
                 ,99);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"Check failed: allow_missing",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Device API ",0xb);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," is not enabled.",0x10);
      dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_1a0);
    }
    pDVar2 = (DeviceAPI *)0x0;
  }
  else {
    TStack_1e8.type_code_ = 4;
    local_1a0._0_8_ = &local_1a8;
    local_1a0._8_8_ = &local_1cc;
    local_190 = 0;
    if (*(long *)(p_Var1 + 1) == 0) {
      local_1d8 = (TVMRetValue *)&TStack_1e8;
      uVar4 = std::__throw_bad_function_call();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar4);
    }
    local_1d8 = (TVMRetValue *)&TStack_1e8;
    (**(code **)((long)p_Var1 + 0x18))(p_Var1,(TVMArgs *)local_1a0,&local_1d8);
    pDVar2 = (DeviceAPI *)TVMPODValue_::operator_cast_to_void_(&TStack_1e8);
    TVMRetValue::Clear((TVMRetValue *)&TStack_1e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  return pDVar2;
}

Assistant:

DeviceAPI *GetAPI(const std::string name, bool allow_missing) {
    std::string factory = "device_api." + name;
    auto *f = Registry::Get(factory);
    if (f == nullptr) {
      CHECK(allow_missing)
          << "Device API " << name << " is not enabled.";
      return nullptr;
    }
    void *ptr = (*f)();
    return static_cast<DeviceAPI *>(ptr);
  }